

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::Update(CClient *this)

{
  CHolder *pCVar1;
  bool bVar2;
  int iVar3;
  CPlaybackInfo *pCVar4;
  int64 iVar5;
  int64 iVar6;
  int64 iVar7;
  long lVar8;
  int64 iVar9;
  long lVar10;
  CConfig *pCVar11;
  CClient *pCVar12;
  int64 iVar13;
  IEngineMasterServer *pIVar14;
  IGameClient *pIVar15;
  int iVar16;
  CClient *in_RDI;
  int64 Now_1;
  int NewPredTick;
  int PrevPredTick;
  int64 PrevtickStart;
  int64 CurtickStart;
  CHolder *pNext;
  int64 TickStart;
  CHolder *pCur;
  int64 PredNow;
  int64 Now;
  int64 Freq;
  int Repredict;
  CPlaybackInfo *pInfo;
  int64 in_stack_ffffffffffffff18;
  CSmoothTime *in_stack_ffffffffffffff20;
  CClient *in_stack_ffffffffffffff28;
  CClient *in_stack_ffffffffffffff48;
  CDemoPlayer *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 ForceResort;
  CServerBrowser *in_stack_ffffffffffffff70;
  
  iVar3 = IClient::State(&in_RDI->super_IClient);
  ForceResort = (undefined1)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  if (iVar3 == 4) {
    CDemoPlayer::Update(in_stack_ffffffffffffff50);
    iVar3 = CDemoPlayer::IsPlaying(&in_RDI->m_DemoPlayer);
    if (iVar3 == 0) {
      (*(in_RDI->super_IClient).super_IInterface._vptr_IInterface[3])();
    }
    else {
      pCVar4 = CDemoPlayer::Info(&in_RDI->m_DemoPlayer);
      (in_RDI->super_IClient).m_CurGameTick = (pCVar4->m_Info).m_CurrentTick;
      (in_RDI->super_IClient).m_PrevGameTick = pCVar4->m_PreviousTick;
      (in_RDI->super_IClient).m_GameIntraTick = pCVar4->m_IntraTick;
      (in_RDI->super_IClient).m_GameTickTime = pCVar4->m_TickTime;
    }
  }
  else {
    iVar3 = IClient::State(&in_RDI->super_IClient);
    ForceResort = (undefined1)((ulong)in_stack_ffffffffffffff68 >> 0x38);
    if ((iVar3 == 3) && (2 < in_RDI->m_ReceivedSnapshots)) {
      bVar2 = false;
      iVar5 = time_freq();
      time_get();
      iVar13 = CSmoothTime::Get((CSmoothTime *)in_stack_ffffffffffffff50,
                                (int64)in_stack_ffffffffffffff48);
      time_get();
      iVar6 = CSmoothTime::Get((CSmoothTime *)in_stack_ffffffffffffff50,
                               (int64)in_stack_ffffffffffffff48);
      while( true ) {
        iVar3 = in_RDI->m_aSnapshots[0]->m_Tick;
        iVar7 = time_freq();
        ForceResort = (undefined1)((ulong)in_stack_ffffffffffffff68 >> 0x38);
        if ((iVar13 <= (iVar3 * iVar7) / 0x32) ||
           (pCVar1 = in_RDI->m_aSnapshots[0]->m_pNext, pCVar1 == (CHolder *)0x0)) break;
        in_RDI->m_aSnapshots[1] = in_RDI->m_aSnapshots[0];
        in_RDI->m_aSnapshots[0] = pCVar1;
        (in_RDI->super_IClient).m_CurGameTick = in_RDI->m_aSnapshots[0]->m_Tick;
        (in_RDI->super_IClient).m_PrevGameTick = in_RDI->m_aSnapshots[1]->m_Tick;
        if ((in_RDI->m_aSnapshots[0] != (CHolder *)0x0) &&
           (in_RDI->m_aSnapshots[1] != (CHolder *)0x0)) {
          pIVar15 = GameClient(in_RDI);
          (*(pIVar15->super_IInterface)._vptr_IInterface[5])();
          bVar2 = true;
        }
      }
      if ((in_RDI->m_aSnapshots[0] != (CHolder *)0x0) && (in_RDI->m_aSnapshots[1] != (CHolder *)0x0)
         ) {
        lVar8 = (long)in_RDI->m_aSnapshots[0]->m_Tick;
        iVar7 = time_freq();
        iVar3 = in_RDI->m_aSnapshots[1]->m_Tick;
        iVar9 = time_freq();
        lVar10 = (iVar3 * iVar9) / 0x32;
        iVar9 = time_freq();
        iVar3 = (int)((iVar6 * 0x32) / iVar9);
        iVar16 = iVar3 + 1;
        (in_RDI->super_IClient).m_GameIntraTick =
             (float)(iVar13 - lVar10) / (float)((lVar8 * iVar7) / 0x32 - lVar10);
        (in_RDI->super_IClient).m_GameTickTime = (float)(iVar13 - lVar10) / (float)iVar5;
        lVar8 = (long)iVar16;
        iVar5 = time_freq();
        lVar10 = lVar8 * iVar5;
        in_stack_ffffffffffffff70 = (CServerBrowser *)(long)iVar3;
        iVar5 = time_freq();
        ForceResort = (undefined1)((ulong)lVar8 >> 0x38);
        lVar8 = ((long)in_stack_ffffffffffffff70 * iVar5) / 0x32;
        (in_RDI->super_IClient).m_PredIntraTick =
             (float)(iVar6 - lVar8) / (float)(lVar10 / 0x32 - lVar8);
        if ((iVar16 < in_RDI->m_aSnapshots[1]->m_Tick + -0x32) ||
           (in_RDI->m_aSnapshots[1]->m_Tick + 0x32 < iVar16)) {
          (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                    (in_RDI->m_pConsole,1,"client","prediction time reset!",0);
          in_stack_ffffffffffffff48 = (CClient *)(long)in_RDI->m_aSnapshots[0]->m_Tick;
          time_freq();
          CSmoothTime::Init(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        }
        if ((in_RDI->super_IClient).m_PredTick < iVar16) {
          (in_RDI->super_IClient).m_PredTick = iVar16;
          bVar2 = true;
          SendInput(in_stack_ffffffffffffff48);
        }
      }
      if (((bVar2) && ((in_RDI->super_IClient).m_CurGameTick < (in_RDI->super_IClient).m_PredTick))
         && ((in_RDI->super_IClient).m_PredTick < (in_RDI->super_IClient).m_CurGameTick + 0x32)) {
        pIVar15 = GameClient(in_RDI);
        (*(pIVar15->super_IInterface)._vptr_IInterface[0xe])();
      }
    }
  }
  pCVar11 = Config(in_RDI);
  if (pCVar11->m_DbgStress != 0) {
    pCVar12 = (CClient *)time_get();
    iVar3 = IClient::State(&in_RDI->super_IClient);
    iVar5 = Update::ActionTaken;
    if (iVar3 == 0) {
      iVar13 = time_freq();
      if (iVar5 + iVar13 * 2 < (long)pCVar12) {
        (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (in_RDI->m_pConsole,2,"stress","reconnecting!",0);
        pCVar11 = Config(in_RDI);
        (*(in_RDI->super_IClient).super_IInterface._vptr_IInterface[2])
                  (in_RDI,pCVar11->m_DbgStressServer);
        Update::ActionTaken = (int64)pCVar12;
      }
    }
    else {
      in_stack_ffffffffffffff28 = pCVar12;
      iVar13 = time_freq();
      pCVar11 = Config(in_RDI);
      if (iVar5 + iVar13 * (pCVar11->m_DbgStress + 10) < (long)in_stack_ffffffffffffff28) {
        (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (in_RDI->m_pConsole,2,"stress","disconnecting!",0);
        (*(in_RDI->super_IClient).super_IInterface._vptr_IInterface[3])();
        Update::ActionTaken = (int64)pCVar12;
      }
    }
  }
  PumpNetwork(in_stack_ffffffffffffff28);
  pIVar14 = MasterServer(in_RDI);
  (*(pIVar14->super_IMasterServer).super_IInterface._vptr_IInterface[7])();
  CServerBrowser::Update(in_stack_ffffffffffffff70,(bool)ForceResort);
  in_RDI->m_ResortServerBrowser = false;
  if ((in_RDI->m_EditorActive & 1U) == 0) {
    pIVar15 = GameClient(in_RDI);
    (*(pIVar15->super_IInterface)._vptr_IInterface[10])();
  }
  return;
}

Assistant:

void CClient::Update()
{
	if(State() == IClient::STATE_DEMOPLAYBACK)
	{
		m_DemoPlayer.Update();
		if(m_DemoPlayer.IsPlaying())
		{
			// update timers
			const CDemoPlayer::CPlaybackInfo *pInfo = m_DemoPlayer.Info();
			m_CurGameTick = pInfo->m_Info.m_CurrentTick;
			m_PrevGameTick = pInfo->m_PreviousTick;
			m_GameIntraTick = pInfo->m_IntraTick;
			m_GameTickTime = pInfo->m_TickTime;
		}
		else
		{
			// disconnect on error
			Disconnect();
		}
	}
	else if(State() == IClient::STATE_ONLINE && m_ReceivedSnapshots >= 3)
	{
		// switch snapshot
		int Repredict = 0;
		int64 Freq = time_freq();
		int64 Now = m_GameTime.Get(time_get());
		int64 PredNow = m_PredictedTime.Get(time_get());

		while(1)
		{
			CSnapshotStorage::CHolder *pCur = m_aSnapshots[SNAP_CURRENT];
			int64 TickStart = (pCur->m_Tick)*time_freq()/50;

			if(TickStart < Now)
			{
				CSnapshotStorage::CHolder *pNext = m_aSnapshots[SNAP_CURRENT]->m_pNext;
				if(pNext)
				{
					m_aSnapshots[SNAP_PREV] = m_aSnapshots[SNAP_CURRENT];
					m_aSnapshots[SNAP_CURRENT] = pNext;

					// set ticks
					m_CurGameTick = m_aSnapshots[SNAP_CURRENT]->m_Tick;
					m_PrevGameTick = m_aSnapshots[SNAP_PREV]->m_Tick;

					if(m_aSnapshots[SNAP_CURRENT] && m_aSnapshots[SNAP_PREV])
					{
						GameClient()->OnNewSnapshot();
						Repredict = 1;
					}
				}
				else
					break;
			}
			else
				break;
		}

		if(m_aSnapshots[SNAP_CURRENT] && m_aSnapshots[SNAP_PREV])
		{
			int64 CurtickStart = (m_aSnapshots[SNAP_CURRENT]->m_Tick)*time_freq()/50;
			int64 PrevtickStart = (m_aSnapshots[SNAP_PREV]->m_Tick)*time_freq()/50;
			int PrevPredTick = (int)(PredNow*50/time_freq());
			int NewPredTick = PrevPredTick+1;

			m_GameIntraTick = (Now - PrevtickStart) / (float)(CurtickStart-PrevtickStart);
			m_GameTickTime = (Now - PrevtickStart) / (float)Freq; //(float)SERVER_TICK_SPEED);

			CurtickStart = NewPredTick*time_freq()/50;
			PrevtickStart = PrevPredTick*time_freq()/50;
			m_PredIntraTick = (PredNow - PrevtickStart) / (float)(CurtickStart-PrevtickStart);

			if(NewPredTick < m_aSnapshots[SNAP_PREV]->m_Tick-SERVER_TICK_SPEED || NewPredTick > m_aSnapshots[SNAP_PREV]->m_Tick+SERVER_TICK_SPEED)
			{
				m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "prediction time reset!");
				m_PredictedTime.Init(m_aSnapshots[SNAP_CURRENT]->m_Tick*time_freq()/50);
			}

			if(NewPredTick > m_PredTick)
			{
				m_PredTick = NewPredTick;
				Repredict = 1;

				// send input
				SendInput();
			}
		}

		// only do sane predictions
		if(Repredict)
		{
			if(m_PredTick > m_CurGameTick && m_PredTick < m_CurGameTick+50)
				GameClient()->OnPredict();
		}
	}

	// STRESS TEST: join the server again
	if(Config()->m_DbgStress)
	{
		static int64 ActionTaken = 0;
		int64 Now = time_get();
		if(State() == IClient::STATE_OFFLINE)
		{
			if(Now > ActionTaken+time_freq()*2)
			{
				m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "stress", "reconnecting!");
				Connect(Config()->m_DbgStressServer);
				ActionTaken = Now;
			}
		}
		else
		{
			if(Now > ActionTaken+time_freq()*(10+Config()->m_DbgStress))
			{
				m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "stress", "disconnecting!");
				Disconnect();
				ActionTaken = Now;
			}
		}
	}

	// pump the network
	PumpNetwork();

	// update the maser server registry
	MasterServer()->Update();

	// update the server browser
	m_ServerBrowser.Update(m_ResortServerBrowser);
	m_ResortServerBrowser = false;

	// update gameclient
	if(!m_EditorActive)
		GameClient()->OnUpdate();
}